

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qanystringview.h
# Opt level: O1

qsizetype __thiscall
QRegularExpressionMatch::capturedStart(QRegularExpressionMatch *this,QAnyStringView name)

{
  QRegularExpressionMatchPrivate *pQVar1;
  int iVar2;
  qsizetype qVar3;
  
  if (((undefined1  [16])name & (undefined1  [16])0x3fffffffffffffff) == (undefined1  [16])0x0) {
    capturedStart();
    qVar3 = -1;
  }
  else {
    iVar2 = QRegularExpressionPrivate::captureIndexForName
                      ((((this->d).d.ptr)->regularExpression).d.d.ptr,name);
    qVar3 = -1;
    if ((-1 < iVar2) && (pQVar1 = (this->d).d.ptr, iVar2 < pQVar1->capturedCount)) {
      qVar3 = (pQVar1->capturedOffsets).d.ptr[(uint)(iVar2 * 2)];
    }
  }
  return qVar3;
}

Assistant:

[[nodiscard]] constexpr bool empty() const noexcept { return size() == 0; }